

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

basic_variable<std::allocator<char>_> *
trial::dynamic::convert::
overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_std::vector<signed_char,_std::allocator<signed_char>_>,_void>
::into(basic_variable<std::allocator<char>_> *__return_storage_ptr__,
      vector<signed_char,_std::allocator<signed_char>_> *array,error_code *param_2)

{
  bool bVar1;
  reference other;
  char *entry;
  const_iterator __end0;
  const_iterator __begin0;
  vector<signed_char,_std::allocator<signed_char>_> *__range3;
  error_code *param_1_local;
  vector<signed_char,_std::allocator<signed_char>_> *array_local;
  basic_variable<std::allocator<char>_> *result;
  
  basic_array<std::allocator<char>_>::make();
  __end0 = std::vector<signed_char,_std::allocator<signed_char>_>::begin(array);
  entry = (char *)std::vector<signed_char,_std::allocator<signed_char>_>::end(array);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                                     *)&entry), bVar1) {
    other = __gnu_cxx::
            __normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
            ::operator*(&__end0);
    basic_variable<std::allocator<char>>::operator+=
              ((basic_variable<std::allocator<char>> *)__return_storage_ptr__,other);
    __gnu_cxx::
    __normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

static basic_variable<Allocator> into(const std::vector<T>& array,
                                          std::error_code&)
    {
        auto result = basic_array<Allocator>::make();
        for (const auto& entry : array)
        {
            result += entry;
        }
        return result;
    }